

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

void __thiscall
flatbuffers::java::JavaGenerator::GenUnionUnPack_ObjectAPI
          (JavaGenerator *this,EnumDef *enum_def,string *code,string *type_name,string *field_name,
          bool is_vector)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  char *pcVar4;
  allocator<char> local_901;
  string local_900;
  string local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  undefined1 local_580 [8];
  string actual_type;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  EnumVal *local_4c0;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_4b0;
  const_iterator eit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  Type local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator<char> local_161;
  undefined1 local_160 [8];
  string indent;
  undefined1 local_138 [8];
  string value_params;
  undefined1 local_110 [8];
  string type_params;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string variable_name;
  string variable_type;
  bool is_vector_local;
  string *field_name_local;
  string *type_name_local;
  string *code_local;
  EnumDef *enum_def_local;
  JavaGenerator *this_local;
  
  if (is_vector) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)((long)&variable_name.field_2 + 8),(ulong)type_name);
  }
  else {
    std::__cxx11::string::string
              ((string *)(variable_name.field_2._M_local_buf + 8),(string *)type_name);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"o",&local_d9);
  Namer::Variable(&local_b8,&(this->namer_).super_Namer,&local_d8,field_name);
  std::operator+(&local_98,"_",&local_b8);
  pcVar4 = "";
  if (is_vector) {
    pcVar4 = "Element";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_98,pcVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pcVar4 = "";
  if (is_vector) {
    pcVar4 = "_j";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,pcVar4,(allocator<char> *)(value_params.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(value_params.field_2._M_local_buf + 0xf));
  pcVar4 = "";
  if (is_vector) {
    pcVar4 = ", _j";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,pcVar4,(allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  pcVar4 = "    ";
  if (is_vector) {
    pcVar4 = "      ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_160,pcVar4,&local_161);
  std::allocator<char>::~allocator(&local_161);
  std::operator+(&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&variable_name.field_2 + 8));
  std::operator+(&local_208,&local_228," ");
  std::operator+(&local_1e8,&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_1c8,&local_1e8," = new ");
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&variable_name.field_2 + 8));
  std::operator+(&local_188,&local_1a8,"();\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  DestinationType(&local_368,this,&enum_def->underlying_type,false);
  GenTypeBasic_abi_cxx11_(&local_348,this,&local_368);
  std::operator+(&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &local_348);
  std::operator+(&local_308,&local_328," ");
  std::operator+(&local_2e8,&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_2c8,&local_2e8,"Type = ");
  std::operator+(&local_2a8,&local_2c8,field_name);
  std::operator+(&local_288,&local_2a8,"Type(");
  std::operator+(&local_268,&local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  std::operator+(&local_248,&local_268,");\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::operator+(&local_3e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_3c8,&local_3e8,".setType(");
  std::operator+(&local_3a8,&local_3c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_388,&local_3a8,"Type);\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::operator+(&local_448,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 "Table ");
  std::operator+(&local_428,&local_448,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_408,&local_428,"Value;\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eit,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 "switch (");
  std::operator+(&local_488,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eit,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_468,&local_488,"Type) {\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&eit);
  pvVar2 = EnumDef::Vals(enum_def);
  local_4b0._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = EnumDef::Vals(enum_def);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_4b0,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_4b0);
    local_4c0 = *ppEVar3;
    if ((((local_4c0->union_type).base_type != BASE_TYPE_NONE) &&
        ((local_4c0->union_type).base_type != BASE_TYPE_STRING)) &&
       (((local_4c0->union_type).base_type != BASE_TYPE_STRUCT ||
        ((((local_4c0->union_type).struct_def)->fixed & 1U) == 0)))) {
      std::operator+(&local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "  case ");
      IdlNamer::NamespacedEnumVariant_abi_cxx11_
                ((string *)((long)&actual_type.field_2 + 8),&this->namer_,enum_def,local_4c0);
      Prefixed(&local_540,this,(string *)((long)&actual_type.field_2 + 8));
      std::operator+(&local_500,&local_520,&local_540);
      std::operator+(&local_4e0,&local_500,":\n");
      std::__cxx11::string::operator+=((string *)code,(string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)(actual_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_520);
      GenTypeGet_abi_cxx11_((string *)local_580,this,&local_4c0->union_type);
      std::operator+(&local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "    ");
      std::operator+(&local_680,&local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_660,&local_680,"Value = ");
      std::operator+(&local_640,&local_660,field_name);
      std::operator+(&local_620,&local_640,"(new ");
      std::operator+(&local_600,&local_620,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580)
      ;
      std::operator+(&local_5e0,&local_600,"()");
      std::operator+(&local_5c0,&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::operator+(&local_5a0,&local_5c0,");\n");
      std::__cxx11::string::operator+=((string *)code,(string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::operator+(&local_7c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "    ");
      std::operator+(&local_7a0,&local_7c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_780,&local_7a0,".setValue(");
      std::operator+(&local_760,&local_780,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_740,&local_760,"Value != null ? ((");
      std::operator+(&local_720,&local_740,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580)
      ;
      std::operator+(&local_700,&local_720,") ");
      std::operator+(&local_6e0,&local_700,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_6c0,&local_6e0,"Value).unpack() : null);\n");
      std::__cxx11::string::operator+=((string *)code,(string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_740);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::operator+(&local_7e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "    break;\n");
      std::__cxx11::string::operator+=((string *)code,(string *)&local_7e0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)local_580);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_4b0);
  }
  std::operator+(&local_800,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 "  default: break;\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::operator+(&local_820,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 "}\n");
  std::__cxx11::string::operator+=((string *)code,(string *)&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  if (is_vector) {
    std::operator+(&local_8c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   "_");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"o",&local_901);
    Namer::Variable(&local_8e0,&(this->namer_).super_Namer,&local_900,field_name);
    std::operator+(&local_8a0,&local_8c0,&local_8e0);
    std::operator+(&local_880,&local_8a0,"[_j] = ");
    std::operator+(&local_860,&local_880,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::operator+(&local_840,&local_860,";\n");
    std::__cxx11::string::operator+=((string *)code,(string *)&local_840);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_880);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator(&local_901);
    std::__cxx11::string::~string((string *)&local_8c0);
  }
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(variable_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string &code,
                                const std::string &type_name,
                                const std::string &field_name,
                                bool is_vector) const {
    const std::string variable_type =
        is_vector ? type_name.substr(0, type_name.length() - 2) : type_name;
    const std::string variable_name =
        "_" + namer_.Variable("o", field_name) + (is_vector ? "Element" : "");
    const std::string type_params = is_vector ? "_j" : "";
    const std::string value_params = is_vector ? ", _j" : "";
    const std::string indent = (is_vector ? "      " : "    ");

    code += indent + variable_type + " " + variable_name + " = new " +
            variable_type + "();\n";
    code += indent +
            GenTypeBasic(DestinationType(enum_def.underlying_type, false)) +
            " " + variable_name + "Type = " + field_name + "Type(" +
            type_params + ");\n";
    code += indent + variable_name + ".setType(" + variable_name + "Type);\n";
    code += indent + "Table " + variable_name + "Value;\n";
    code += indent + "switch (" + variable_name + "Type) {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        continue;
      } else {
        if (ev.union_type.base_type == BASE_TYPE_STRING ||
            (ev.union_type.base_type == BASE_TYPE_STRUCT &&
             ev.union_type.struct_def->fixed)) {
          continue;  // This branch is due to bad implemantation of Unions in
                     // Java which doesn't handle non Table types. Should be
                     // deleted when issue #6561 is fixed.
        }
        code += indent + "  case " +
                Prefixed(namer_.NamespacedEnumVariant(enum_def, ev)) + ":\n";
        auto actual_type = GenTypeGet(ev.union_type);
        code += indent + "    " + variable_name + "Value = " + field_name +
                "(new " + actual_type + "()" + value_params + ");\n";
        code += indent + "    " + variable_name + ".setValue(" + variable_name +
                "Value != null ? ((" + actual_type + ") " + variable_name +
                "Value).unpack() : null);\n";
        code += indent + "    break;\n";
      }
    }
    code += indent + "  default: break;\n";
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_" + namer_.Variable("o", field_name) +
              "[_j] = " + variable_name + ";\n";
    }
  }